

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  string *s;
  size_t __n;
  Version *this_00;
  FileDescriptorProto *this_01;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  uint8 *puVar9;
  uint8 *puVar10;
  
  lVar8 = (long)(this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar8) {
    lVar6 = 0;
    do {
      s = (string *)((this->file_to_generate_).super_RepeatedPtrFieldBase.rep_)->elements[lVar6];
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\n';
        target[1] = (uint8)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,target);
      }
      lVar6 = lVar6 + 1;
    } while (lVar8 != lVar6);
  }
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->parameter_).ptr_,target);
  }
  if ((uVar4 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->compiler_version_;
    *target = '\x1a';
    uVar4 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar4 < 0x80) {
      target[1] = (byte)uVar4;
      puVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      if (uVar4 < 0x4000) {
        target[2] = (uint8)(uVar4 >> 7);
        puVar9 = target + 3;
      }
      else {
        puVar9 = target + 3;
        uVar4 = uVar4 >> 7;
        do {
          puVar10 = puVar9;
          puVar10[-1] = (byte)uVar4 | 0x80;
          uVar5 = uVar4 >> 7;
          puVar9 = puVar10 + 1;
          bVar3 = 0x3fff < uVar4;
          uVar4 = uVar5;
        } while (bVar3);
        *puVar10 = (uint8)uVar5;
      }
    }
    target = Version::InternalSerializeWithCachedSizesToArray(this_00,puVar9,stream);
  }
  iVar1 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar7 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_01 = (FileDescriptorProto *)
                ((this->proto_file_).super_RepeatedPtrFieldBase.rep_)->elements[iVar7];
      *target = 'z';
      uVar4 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar4 < 0x80) {
        target[1] = (byte)uVar4;
        puVar9 = target + 2;
      }
      else {
        target[1] = (byte)uVar4 | 0x80;
        if (uVar4 < 0x4000) {
          target[2] = (uint8)(uVar4 >> 7);
          puVar9 = target + 3;
        }
        else {
          puVar9 = target + 3;
          uVar4 = uVar4 >> 7;
          do {
            puVar10 = puVar9;
            puVar10[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            puVar9 = puVar10 + 1;
            bVar3 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar3);
          *puVar10 = (uint8)uVar5;
        }
      }
      target = FileDescriptorProto::InternalSerializeWithCachedSizesToArray(this_01,puVar9,stream);
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar1);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar9 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target,stream);
    return puVar9;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->_internal_file_to_generate_size(); i < n; i++) {
    const auto& s = this->_internal_file_to_generate(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = stream->WriteString(1, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_parameter().data(), static_cast<int>(this->_internal_parameter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::compiler_version(this), target, stream);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_proto_file_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(15, this->_internal_proto_file(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}